

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

int smlEscapeQuotedString(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  xmlChar *pxVar5;
  
  iVar3 = (int)out;
  pxVar5 = out + *outlen;
  iVar2 = *inlen;
  lVar4 = 0;
  do {
    if ((in + iVar2 <= in + lVar4) || (pxVar5 <= out)) {
      *outlen = (int)out - iVar3;
      *inlen = (int)lVar4;
      return 0;
    }
    xVar1 = in[lVar4];
    if ((xVar1 == '\\') || (xVar1 == '\"')) {
      if (pxVar5 <= out + 1) {
        return -1;
      }
      *out = '\\';
      out = out + 1;
    }
    if (xVar1 == '>') {
      builtin_memcpy(out,"&gt;",4);
LAB_001a9620:
      out = out + 4;
    }
    else {
      if (xVar1 == '<') {
        builtin_memcpy(out,"&lt;",4);
        goto LAB_001a9620;
      }
      if (xVar1 == '&') {
        builtin_memcpy(out,"&amp;",5);
        out = out + 5;
      }
      else {
        *out = xVar1;
        out = out + 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

static int
smlEscapeQuotedString(unsigned char* out, int *outlen,
		      const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend = in + *inlen;

    /* Escape the \ and " characters */
    while ((in < inend) && (out < outend)) {
    	char c = *in++;
    	if (c == '\\' || c == '"') {
    	    if ((out+1) >= outend) return -1;
	    *out++ = '\\';
    	}
	/* TODO FOR SML: Convert characters not in the output encoding to &#NNN entities */
	switch(c) {
	case '&':
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    break;
	case '<':
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	case '>':
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	default:
	    *out++ = c;
	    break;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
}